

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O1

size_t showHelpIntro(poptContext con,FILE *fp)

{
  poptArgv ppcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  poptString __s;
  
  POPT_fprintf(fp,"%s","Usage:");
  sVar2 = 6;
  if ((con->flags & 2) == 0) {
    ppcVar1 = con->optionStack[0].argv;
    if (ppcVar1 == (poptArgv)0x0) {
      __s = (char *)0x0;
    }
    else {
      __s = *ppcVar1;
    }
    if (__s != (char *)0x0) {
      pcVar3 = strchr(__s,0x2f);
      if (pcVar3 != (char *)0x0) {
        pcVar3 = strrchr(__s,0x2f);
        __s = pcVar3 + 1;
      }
      fprintf((FILE *)fp," %s",__s);
      sVar4 = strlen(__s);
      sVar2 = sVar4 + 7;
    }
  }
  return sVar2;
}

Assistant:

static size_t showHelpIntro(poptContext con, FILE * fp)
{
    const char *usage_str = POPT_("Usage:");
    size_t len = strlen(usage_str);
    POPT_fprintf(fp, "%s", usage_str);

    if (!(con->flags & POPT_CONTEXT_KEEP_FIRST)) {
	struct optionStackEntry * os = con->optionStack;
	const char * fn = (os->argv ? os->argv[0] : NULL);
	if (fn == NULL) return len;
	if (strchr(fn, '/')) fn = strrchr(fn, '/') + 1;
	/* XXX POPT_fprintf not needed for argv[0] display. */
	fprintf(fp, " %s", fn);
	len += strlen(fn) + 1;
    }

    return len;
}